

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int eval_preprocessor_boolean(char *z,int lineno)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  uint in_ESI;
  long in_RDI;
  bool bVar4;
  int n_1;
  int k_1;
  int j;
  int n;
  int k;
  int i;
  int okTerm;
  int res;
  int neg;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  uint lineno_00;
  uint uVar5;
  
  uVar5 = 0;
  lineno_00 = 0;
  bVar4 = true;
  local_24 = 0;
  do {
    if (*(char *)(in_RDI + local_24) == '\0') {
      return lineno_00;
    }
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)(uint)*(byte *)(in_RDI + local_24)] & 0x2000) == 0) {
      if (*(char *)(in_RDI + local_24) == '!') {
        if (!bVar4) goto LAB_001134ac;
        uVar5 = (uint)((uVar5 != 0 ^ 0xffU) & 1);
      }
      else if ((*(char *)(in_RDI + local_24) == '|') && (*(char *)(in_RDI + (local_24 + 1)) == '|'))
      {
        if (bVar4) goto LAB_001134ac;
        if (lineno_00 != 0) {
          return 1;
        }
        bVar4 = true;
        local_24 = local_24 + 1;
      }
      else if ((*(char *)(in_RDI + local_24) == '&') && (*(char *)(in_RDI + (local_24 + 1)) == '&'))
      {
        if (bVar4) goto LAB_001134ac;
        if (lineno_00 == 0) {
          return 0;
        }
        bVar4 = true;
        local_24 = local_24 + 1;
      }
      else if (*(char *)(in_RDI + local_24) == '(') {
        local_2c = 1;
        local_28 = local_24;
        if (!bVar4) {
LAB_001134ac:
          if ((int)in_ESI < 1) {
            return -(local_24 + 1);
          }
          fprintf(_stderr,"%%if syntax error on line %d.\n",(ulong)in_ESI);
          fprintf(_stderr,"  %.*s <-- syntax error here\n",(ulong)(local_24 + 1),in_RDI);
          exit(1);
        }
        do {
          while( true ) {
            local_28 = local_28 + 1;
            if (*(char *)(in_RDI + local_28) == '\0') goto LAB_00113301;
            if (*(char *)(in_RDI + local_28) == ')') break;
            if (*(char *)(in_RDI + local_28) == '(') {
              local_2c = local_2c + 1;
            }
            else if (*(char *)(in_RDI + local_28) == '\0') {
              local_24 = local_28;
              goto LAB_001134ac;
            }
          }
          local_2c = local_2c + -1;
        } while (local_2c != 0);
        *(undefined1 *)(in_RDI + local_28) = 0;
        lineno_00 = eval_preprocessor_boolean((char *)CONCAT44(in_ESI,uVar5),lineno_00);
        *(undefined1 *)(in_RDI + local_28) = 0x29;
        if ((int)lineno_00 < 0) {
          local_24 = local_24 - lineno_00;
          goto LAB_001134ac;
        }
        local_24 = local_28;
LAB_00113301:
        if (uVar5 != 0) {
          lineno_00 = (uint)((lineno_00 != 0 ^ 0xffU) & 1);
          uVar5 = 0;
        }
        bVar4 = false;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        if ((((*ppuVar3)[(int)(uint)*(byte *)(in_RDI + local_24)] & 0x400) == 0) ||
           (iVar2 = local_24, !bVar4)) goto LAB_001134ac;
        do {
          iVar1 = iVar2;
          local_34 = iVar1 + 1;
          ppuVar3 = __ctype_b_loc();
          bVar4 = true;
          if (((*ppuVar3)[(int)(uint)*(byte *)(in_RDI + local_34)] & 8) == 0) {
            bVar4 = *(char *)(in_RDI + local_34) == '_';
          }
          iVar2 = local_34;
        } while (bVar4);
        lineno_00 = 0;
        for (local_30 = 0; local_30 < nDefine; local_30 = local_30 + 1) {
          iVar2 = strncmp(azDefine[local_30],(char *)(in_RDI + local_24),(long)(local_34 - local_24)
                         );
          if ((iVar2 == 0) && (azDefine[local_30][local_34 - local_24] == '\0')) {
            lineno_00 = 1;
            break;
          }
        }
        if (uVar5 != 0) {
          lineno_00 = (uint)((lineno_00 != 0 ^ 0xffU) & 1);
          uVar5 = 0;
        }
        bVar4 = false;
        local_24 = iVar1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static int eval_preprocessor_boolean(char *z, int lineno){
  int neg = 0;
  int res = 0;
  int okTerm = 1;
  int i;
  for(i=0; z[i]!=0; i++){
    if( ISSPACE(z[i]) ) continue;
    if( z[i]=='!' ){
      if( !okTerm ) goto pp_syntax_error;
      neg = !neg;
      continue;
    }
    if( z[i]=='|' && z[i+1]=='|' ){
      if( okTerm ) goto pp_syntax_error;
      if( res ) return 1;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='&' && z[i+1]=='&' ){
      if( okTerm ) goto pp_syntax_error;
      if( !res ) return 0;
      i++;
      okTerm = 1;
      continue;
    }
    if( z[i]=='(' ){
      int k;
      int n = 1;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; z[k]; k++){
        if( z[k]==')' ){
          n--;
          if( n==0 ){
            z[k] = 0;
            res = eval_preprocessor_boolean(&z[i+1], -1);
            z[k] = ')';
            if( res<0 ){
              i = i-res;
              goto pp_syntax_error;
            }
            i = k;
            break;
          }
        }else if( z[k]=='(' ){
          n++;
        }else if( z[k]==0 ){
          i = k;
          goto pp_syntax_error;
        }
      }
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    if( ISALPHA(z[i]) ){
      int j, k, n;
      if( !okTerm ) goto pp_syntax_error;
      for(k=i+1; ISALNUM(z[k]) || z[k]=='_'; k++){}
      n = k - i;
      res = 0;
      for(j=0; j<nDefine; j++){
        if( strncmp(azDefine[j],&z[i],n)==0 && azDefine[j][n]==0 ){
          res = 1;
          break;
        }
      }
      i = k-1;
      if( neg ){
        res = !res;
        neg = 0;
      }
      okTerm = 0;
      continue;
    }
    goto pp_syntax_error;
  }
  return res;

pp_syntax_error:
  if( lineno>0 ){
    fprintf(stderr, "%%if syntax error on line %d.\n", lineno);
    fprintf(stderr, "  %.*s <-- syntax error here\n", i+1, z);
    exit(1);
  }else{
    return -(i+1);
  }
}